

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::PrecisionCase::
testStatement<vkt::shaderexecutor::InTypes<tcu::Vector<float,2>,tcu::Vector<float,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>,vkt::shaderexecutor::OutTypes<tcu::Vector<float,2>,vkt::shaderexecutor::Void>>
          (PrecisionCase *this,
          Variables<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void>_>
          *variables,Statement *stmt)

{
  ostream *poVar1;
  char *pcVar2;
  ulong uVar3;
  Variable<vkt::shaderexecutor::Void> *pVVar4;
  reference pvVar5;
  Variable<tcu::Vector<float,_2>_> *pVVar6;
  string local_3b0;
  Symbol local_390;
  Symbol local_358;
  Symbol local_320;
  Symbol local_2e8;
  Symbol local_2b0;
  Symbol local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  string local_200 [48];
  ostringstream local_1d0 [8];
  ostringstream os;
  undefined1 local_58 [8];
  Environment env;
  int outCount;
  int inCount;
  Statement *stmt_local;
  Variables<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void>_>
  *variables_local;
  PrecisionCase *this_local;
  
  env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
       numInputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,2>,tcu::Vector<float,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
                 ();
  env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
       numOutputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,2>,vkt::shaderexecutor::Void>>();
  Environment::Environment((Environment *)local_58);
  std::__cxx11::ostringstream::ostringstream(local_1d0);
  poVar1 = std::operator<<((ostream *)local_1d0,"precision ");
  pcVar2 = glu::getPrecisionName((this->m_ctx).precision);
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1," float;\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=((string *)&(this->m_spec).globalDeclarations,local_200);
  std::__cxx11::string::~string(local_200);
  std::__cxx11::ostringstream::~ostringstream(local_1d0);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::operator+(&local_240,"#extension ",&this->m_extension);
    std::operator+(&local_220,&local_240," : require\n");
    std::__cxx11::string::operator=
              ((string *)&(this->m_spec).globalDeclarations,(string *)&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_240);
  }
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::resize
            (&(this->m_spec).inputs,
             (long)env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
  switch(env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_) {
  case 4:
    pVVar4 = de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::
             operator*(&(variables->in3).
                        super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                      );
    makeSymbol<vkt::shaderexecutor::Void>(&local_278,this,pVVar4);
    pvVar5 = std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
             ::operator[](&(this->m_spec).inputs,3);
    Symbol::operator=(pvVar5,&local_278);
    Symbol::~Symbol(&local_278);
  case 3:
    pVVar4 = de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::
             operator*(&(variables->in2).
                        super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                      );
    makeSymbol<vkt::shaderexecutor::Void>(&local_2b0,this,pVVar4);
    pvVar5 = std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
             ::operator[](&(this->m_spec).inputs,2);
    Symbol::operator=(pvVar5,&local_2b0);
    Symbol::~Symbol(&local_2b0);
  case 2:
    pVVar6 = de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>::operator*
                       (&(variables->in1).
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>
                       );
    makeSymbol<tcu::Vector<float,2>>(&local_2e8,this,pVVar6);
    pvVar5 = std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
             ::operator[](&(this->m_spec).inputs,1);
    Symbol::operator=(pvVar5,&local_2e8);
    Symbol::~Symbol(&local_2e8);
  case 1:
    pVVar6 = de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>::operator*
                       ((SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_> *)
                        variables);
    makeSymbol<tcu::Vector<float,2>>(&local_320,this,pVVar6);
    pvVar5 = std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
             ::operator[](&(this->m_spec).inputs,0);
    Symbol::operator=(pvVar5,&local_320);
    Symbol::~Symbol(&local_320);
  }
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::resize
            (&(this->m_spec).outputs,
             (long)(int)env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if ((int)env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count != 1) {
    if ((int)env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count != 2) goto LAB_00fb0523;
    pVVar4 = de::SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>::
             operator*(&(variables->out1).
                        super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                      );
    makeSymbol<vkt::shaderexecutor::Void>(&local_358,this,pVVar4);
    pvVar5 = std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
             ::operator[](&(this->m_spec).outputs,1);
    Symbol::operator=(pvVar5,&local_358);
    Symbol::~Symbol(&local_358);
  }
  pVVar6 = de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>::operator*
                     (&(variables->out0).
                       super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>
                     );
  makeSymbol<tcu::Vector<float,2>>(&local_390,this,pVVar6);
  pvVar5 = std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
           operator[](&(this->m_spec).outputs,0);
  Symbol::operator=(pvVar5,&local_390);
  Symbol::~Symbol(&local_390);
LAB_00fb0523:
  de::toString<vkt::shaderexecutor::Statement>(&local_3b0,stmt);
  std::__cxx11::string::operator=((string *)&(this->m_spec).source,(string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_3b0);
  Environment::~Environment((Environment *)local_58);
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>& variables, const Statement& stmt)
{
	const int		inCount		= numInputs<In>();
	const int		outCount	= numOutputs<Out>();
	Environment		env;		// Hoisted out of the inner loop for optimization.

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		m_spec.globalDeclarations = os.str();
	}

	if (!m_extension.empty())
		m_spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	m_spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: m_spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	m_spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	m_spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	m_spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	m_spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	m_spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	m_spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	m_spec.source = de::toString(stmt);
}